

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

void destroy_size(FT_Memory memory,FT_Size size,FT_Driver driver)

{
  FT_Generic_Finalizer p_Var1;
  FT_Size_DoneFunc p_Var2;
  
  p_Var1 = (size->generic).finalizer;
  if (p_Var1 != (FT_Generic_Finalizer)0x0) {
    (*p_Var1)(size);
  }
  p_Var2 = driver->clazz->done_size;
  if (p_Var2 != (FT_Size_DoneFunc)0x0) {
    (*p_Var2)(size);
  }
  if (size->internal != (FT_Size_Internal)0x0) {
    (*memory->free)(memory,size->internal);
  }
  size->internal = (FT_Size_Internal)0x0;
  if (size != (FT_Size)0x0) {
    (*memory->free)(memory,size);
    return;
  }
  return;
}

Assistant:

static void
  destroy_size( FT_Memory  memory,
                FT_Size    size,
                FT_Driver  driver )
  {
    /* finalize client-specific data */
    if ( size->generic.finalizer )
      size->generic.finalizer( size );

    /* finalize format-specific stuff */
    if ( driver->clazz->done_size )
      driver->clazz->done_size( size );

    FT_FREE( size->internal );
    FT_FREE( size );
  }